

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

bool __thiscall pbrt::DisplayItem::SendOpenImage(DisplayItem *this,IPCChannel *ipcChannel)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  span<const_unsigned_char> message;
  uint8_t buffer [1024];
  int *local_430;
  uchar local_428 [6];
  int local_422 [254];
  
  local_430 = local_422;
  local_428[0] = '\0';
  local_428[1] = '\0';
  local_428[2] = '\0';
  local_428[3] = '\0';
  local_428[4] = '\x04';
  local_428[5] = '\x01';
  anon_unknown_2::Serialize((uint8_t **)&local_430,&this->title);
  pbVar1 = (this->channelNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->channelNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *local_430 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_430[1] = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  uVar4 = (uint)((ulong)((long)pbVar1 - (long)pbVar2) >> 5);
  local_430[2] = uVar4;
  local_430 = local_430 + 3;
  for (lVar5 = 0; (ulong)(~((int)uVar4 >> 0x1f) & uVar4) << 5 != lVar5; lVar5 = lVar5 + 0x20) {
    anon_unknown_2::Serialize
              ((uint8_t **)&local_430,
               (string *)
               ((long)&(((this->channelNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
  }
  message.n = (long)local_430 - (long)local_428;
  message.ptr = local_428;
  bVar3 = IPCChannel::Send(ipcChannel,message);
  return bVar3;
}

Assistant:

bool DisplayItem::SendOpenImage(IPCChannel &ipcChannel) {
    // Initial "open the image" message
    uint8_t buffer[1024];
    uint8_t *ptr = buffer;

    Serialize(&ptr, int(0));  // reserve space for message length
    Serialize(&ptr, DisplayDirective::CreateImage);
    uint8_t grabFocus = 1;
    Serialize(&ptr, grabFocus);
    Serialize(&ptr, title);

    int nChannels = channelNames.size();
    Serialize(&ptr, resolution.x);
    Serialize(&ptr, resolution.y);
    Serialize(&ptr, nChannels);
    for (int c = 0; c < nChannels; ++c)
        Serialize(&ptr, channelNames[c]);

    return ipcChannel.Send(pstd::MakeSpan(buffer, ptr - buffer));
}